

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_paged_audio_buffer_data_allocate_page
                    (ma_paged_audio_buffer_data *pData,ma_uint64 pageSizeInFrames,void *pInitialData
                    ,ma_allocation_callbacks *pAllocationCallbacks,
                    ma_paged_audio_buffer_page **ppPage)

{
  ma_result mVar1;
  ma_paged_audio_buffer_page *pmVar2;
  
  mVar1 = MA_INVALID_ARGS;
  if ((ppPage != (ma_paged_audio_buffer_page **)0x0) &&
     (*ppPage = (ma_paged_audio_buffer_page *)0x0, mVar1 = MA_INVALID_ARGS,
     pData != (ma_paged_audio_buffer_data *)0x0)) {
    pmVar2 = (ma_paged_audio_buffer_page *)
             ma_malloc((*(int *)(&DAT_00176420 + (ulong)pData->format * 4) * pData->channels) *
                       pageSizeInFrames + 0x18,pAllocationCallbacks);
    if (pmVar2 == (ma_paged_audio_buffer_page *)0x0) {
      mVar1 = MA_OUT_OF_MEMORY;
    }
    else {
      pmVar2->pNext = (ma_paged_audio_buffer_page *)0x0;
      pmVar2->sizeInFrames = pageSizeInFrames;
      if ((pInitialData != (void *)0x0) && (pmVar2->pAudioData != (ma_uint8 *)pInitialData)) {
        memcpy(pmVar2->pAudioData,pInitialData,
               (*(int *)(&DAT_00176420 + (ulong)pData->format * 4) * pData->channels) *
               pageSizeInFrames);
      }
      *ppPage = pmVar2;
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_allocate_page(ma_paged_audio_buffer_data* pData, ma_uint64 pageSizeInFrames, const void* pInitialData, const ma_allocation_callbacks* pAllocationCallbacks, ma_paged_audio_buffer_page** ppPage)
{
    ma_paged_audio_buffer_page* pPage;
    ma_uint64 allocationSize;

    if (ppPage == NULL) {
        return MA_INVALID_ARGS;
    }

    *ppPage = NULL;

    if (pData == NULL) {
        return MA_INVALID_ARGS;
    }

    allocationSize = sizeof(*pPage) + (pageSizeInFrames * ma_get_bytes_per_frame(pData->format, pData->channels));
    if (allocationSize > MA_SIZE_MAX) {
        return MA_OUT_OF_MEMORY;    /* Too big. */
    }

    pPage = (ma_paged_audio_buffer_page*)ma_malloc((size_t)allocationSize, pAllocationCallbacks);   /* Safe cast to size_t. */
    if (pPage == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    pPage->pNext = NULL;
    pPage->sizeInFrames = pageSizeInFrames;

    if (pInitialData != NULL) {
        ma_copy_pcm_frames(pPage->pAudioData, pInitialData, pageSizeInFrames, pData->format, pData->channels);
    }

    *ppPage = pPage;

    return MA_SUCCESS;
}